

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void compareUnit(UnitsPtr *u1,UnitsPtr *u2)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  element_type *peVar5;
  AssertHelper local_1e0 [8];
  Message local_1d8 [8];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8 [8];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198 [8];
  undefined1 local_190 [8];
  AssertionResult gtest_ar_3;
  Message local_178 [8];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158 [8];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  size_t index;
  double multiplier2;
  double exponent2;
  double multiplier1;
  double exponent1;
  string id2;
  string prefix2;
  string reference2;
  string id1;
  string prefix1;
  string reference1;
  Message local_50 [24];
  unsigned_long local_38;
  unsigned_long local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  UnitsPtr *u2_local;
  UnitsPtr *u1_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)u2;
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)u1);
  local_30 = libcellml::Units::unitCount();
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_38 = libcellml::Units::unitCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_28,"u1->unitCount()","u2->unitCount()",&local_30,&local_38);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(reference1.field_2._M_local_buf + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x13c,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(reference1.field_2._M_local_buf + 8),local_50);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(reference1.field_2._M_local_buf + 8));
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  std::__cxx11::string::string((string *)(prefix1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(id1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(reference2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(prefix2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(id2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&exponent1);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    sVar1.ptr_ = gtest_ar_1.message_.ptr_;
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)u1
              );
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             libcellml::Units::unitCount();
    if (pbVar4 <= sVar1.ptr_) break;
    peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)u1);
    libcellml::Units::unitAttributes
              ((ulong)peVar5,(string *)gtest_ar_1.message_.ptr_,
               (string *)(prefix1.field_2._M_local_buf + 8),(double *)((long)&id1.field_2 + 8),
               &multiplier1,(string *)&exponent2);
    peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)gtest_ar.message_.ptr_);
    libcellml::Units::unitAttributes
              ((ulong)peVar5,(string *)gtest_ar_1.message_.ptr_,
               (string *)(prefix2.field_2._M_local_buf + 8),(double *)((long)&id2.field_2 + 8),
               &multiplier2,(string *)&index);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_150,"reference1","reference2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&prefix1.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&prefix2.field_2 + 8));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar2) {
      testing::Message::Message(local_158);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_170,"prefix1","prefix2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&id1.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&id2.field_2 + 8));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar2) {
      testing::Message::Message(local_178);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_190,"exponent1","exponent2",&multiplier1,&multiplier2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar2) {
      testing::Message::Message(local_198);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_1b0,"multiplier1","multiplier2",&exponent2,(double *)&index)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar2) {
      testing::Message::Message(local_1b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1d0,"id1","id2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&reference2.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exponent1);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
    if (!bVar2) {
      testing::Message::Message(local_1d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
      testing::internal::AssertHelper::AssertHelper
                (local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x150,pcVar3);
      testing::internal::AssertHelper::operator=(local_1e0,local_1d8);
      testing::internal::AssertHelper::~AssertHelper(local_1e0);
      testing::Message::~Message(local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_1.message_.ptr_)->field_0x1;
  }
  std::__cxx11::string::~string((string *)&exponent1);
  std::__cxx11::string::~string((string *)(id2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prefix2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(reference2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(id1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prefix1.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compareUnit(const libcellml::UnitsPtr &u1, const libcellml::UnitsPtr &u2)
{
    EXPECT_EQ(u1->unitCount(), u2->unitCount());

    std::string reference1;
    std::string prefix1;
    std::string id1;
    std::string reference2;
    std::string prefix2;
    std::string id2;
    double exponent1;
    double multiplier1;
    double exponent2;
    double multiplier2;
    for (size_t index = 0; index < u1->unitCount(); ++index) {
        u1->unitAttributes(index, reference1, prefix1, exponent1, multiplier1, id1);
        u2->unitAttributes(index, reference2, prefix2, exponent2, multiplier2, id2);

        EXPECT_EQ(reference1, reference2);
        EXPECT_EQ(prefix1, prefix2);
        EXPECT_EQ(exponent1, exponent2);
        EXPECT_EQ(multiplier1, multiplier2);
        EXPECT_EQ(id1, id2);
    }
}